

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cc
# Opt level: O1

RC __thiscall
StatisticsMgr::Register(StatisticsMgr *this,char *psKey,Stat_Operation op,int *piValue)

{
  int *piVar1;
  uint uVar2;
  InternalNode *pIVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  InternalNode *this_00;
  InternalNode *this_01;
  InternalNode **ppIVar9;
  uint uVar10;
  uint uVar11;
  
  if (psKey == (char *)0x0) {
    return 0x2329;
  }
  if (op != STAT_ADDONE && piValue == (int *)0x0) {
    return 0x2329;
  }
  uVar2 = (this->llStats).iLength;
  if ((int)uVar2 < 1) {
    this_00 = (InternalNode *)0x0;
    uVar7 = 0;
  }
  else {
    uVar11 = 0;
    uVar6 = (this->llStats).iLastRef;
    do {
      uVar10 = uVar11 + 1;
      if (uVar6 == 0xffffffff) {
        uVar7 = uVar2;
        if ((int)uVar10 < (int)(uVar2 - uVar10)) {
          uVar7 = 1;
        }
        ppIVar9 = &(this->llStats).pnHead + ((int)(uVar2 - uVar10) <= (int)uVar10);
      }
      else {
        uVar7 = uVar10 - uVar6;
        uVar5 = -uVar7;
        if (0 < (int)uVar7) {
          uVar5 = uVar7;
        }
        uVar7 = 1;
        ppIVar9 = &(this->llStats).pnHead;
        if (uVar5 <= uVar10) {
          uVar7 = uVar6;
          if ((int)(uVar2 - uVar10) <= (int)uVar5) {
            uVar7 = uVar2;
          }
          ppIVar9 = &(this->llStats).pnTail + ((int)uVar5 < (int)(uVar2 - uVar10));
        }
      }
      this_00 = *ppIVar9;
      for (; uVar7 != uVar10; uVar7 = uVar7 + (-(uint)((int)uVar11 < (int)uVar7) | 1)) {
        this_00 = (&this_00->next)[(int)uVar11 < (int)uVar7];
      }
      (this->llStats).iLastRef = uVar10;
      (this->llStats).pnLastRef = this_00;
      iVar8 = strcmp(psKey,(this_00->Data).psKey);
      uVar7 = uVar11;
    } while ((iVar8 != 0) && (uVar11 = uVar11 + 1, uVar7 = uVar2, uVar6 = uVar10, uVar11 != uVar2));
  }
  if (uVar7 == uVar2) {
    this_00 = (InternalNode *)operator_new(0x10);
    Statistic::Statistic((Statistic *)this_00,psKey);
  }
  switch(op) {
  case STAT_ADDONE:
    piVar1 = &(this_00->Data).iValue;
    *piVar1 = *piVar1 + 1;
    break;
  case STAT_ADDVALUE:
    piVar1 = &(this_00->Data).iValue;
    *piVar1 = *piVar1 + *piValue;
    break;
  case STAT_SETVALUE:
    iVar8 = *piValue;
    goto LAB_001066fe;
  case STAT_MULTVALUE:
    iVar8 = (this_00->Data).iValue * *piValue;
    goto LAB_001066fe;
  case STAT_DIVVALUE:
    iVar8 = (this_00->Data).iValue / *piValue;
LAB_001066fe:
    (this_00->Data).iValue = iVar8;
    break;
  case STAT_SUBVALUE:
    piVar1 = &(this_00->Data).iValue;
    *piVar1 = *piVar1 - *piValue;
  }
  if (uVar7 == uVar2) {
    this_01 = (InternalNode *)operator_new(0x20);
    (this_01->Data).psKey = (char *)0x0;
    (this_01->Data).iValue = 0;
    Statistic::operator=((Statistic *)this_01,&this_00->Data);
    this_01->next = (InternalNode *)0x0;
    pIVar3 = (this->llStats).pnTail;
    this_01->previous = pIVar3;
    iVar8 = (this->llStats).iLength;
    if (iVar8 == 0) {
      (this->llStats).pnHead = this_01;
      (this->llStats).pnTail = this_01;
      ppIVar9 = &(this->llStats).pnLastRef;
    }
    else {
      ppIVar9 = &(this->llStats).pnTail;
      pIVar3->next = this_01;
    }
    *ppIVar9 = this_01;
    (this->llStats).iLength = iVar8 + 1;
    pcVar4 = (this_00->Data).psKey;
    if (pcVar4 != (char *)0x0) {
      operator_delete__(pcVar4);
    }
    operator_delete(this_00);
  }
  return 0;
}

Assistant:

RC StatisticsMgr::Register (const char *psKey, const Stat_Operation op,
      const int *const piValue)
{
   int i, iCount;
   Statistic *pStat = NULL;

   if (psKey==NULL || (op != STAT_ADDONE && piValue == NULL))
      return STAT_INVALID_ARGS;

   iCount = llStats.GetLength();

   for (i=0; i < iCount; i++) {
      pStat = llStats[i];
      if (*pStat == psKey)
         break;
   }

   // Check to see if we found the Stat
   if (i==iCount)
      // We haven't found it so create a new statistic
      // with the key psKey and initial value of 0.
      pStat = new Statistic( psKey );

   // Now perform the operation over the statistic
   switch (op) {
      case STAT_ADDONE:
         pStat->iValue++;
         break;
      case STAT_ADDVALUE:
         pStat->iValue += *piValue;
         break;
      case STAT_SETVALUE:
         pStat->iValue = *piValue;
         break;
      case STAT_MULTVALUE:
         pStat->iValue *= *piValue;
         break;
      case STAT_DIVVALUE:
         pStat->iValue = (int) (pStat->iValue/(*piValue));
         break;
      case STAT_SUBVALUE:
         pStat->iValue -= *piValue;
         break;
   };

   // Finally, if the statistic wasn't in the original list then add it to
   // the list.
   //  JASON:: Confirm that it makes a copy of the object in line 229 of
   //  linkedlist.h.
   if (i==iCount) {
      llStats.Append(*pStat);
      delete pStat;
   }

   return 0;
}